

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall
CTxIn::CTxIn(CTxIn *this,COutPoint prevoutIn,CScript *scriptSigIn,uint32_t nSequenceIn)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined4 in_stack_00000028;
  COutPoint *in_stack_ffffffffffffff98;
  CScript *in_stack_ffffffffffffffa0;
  CScript *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  COutPoint::COutPoint(in_stack_ffffffffffffff98);
  CScript::CScript((CScript *)in_stack_ffffffffffffff98);
  this_00 = (CScript *)(in_RDI + 10);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffff98);
  *(undefined4 *)(in_RDI + 4) = in_stack_00000028;
  in_RDI[2] = in_stack_00000018;
  in_RDI[3] = in_stack_00000020;
  *in_RDI = in_stack_00000008;
  in_RDI[1] = in_stack_00000010;
  CScript::operator=(this_00,in_stack_ffffffffffffffa0);
  *(undefined4 *)(in_RDI + 9) = in_EDX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxIn::CTxIn(COutPoint prevoutIn, CScript scriptSigIn, uint32_t nSequenceIn)
{
    prevout = prevoutIn;
    scriptSig = scriptSigIn;
    nSequence = nSequenceIn;
}